

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall V1Transport::MarkBytesSent(V1Transport *this,size_t bytes_sent)

{
  size_type sVar1;
  Mutex *pMVar2;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock41;
  Mutex *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  size_type sVar3;
  char *in_stack_ffffffffffffffc8;
  char *pszFile;
  char *in_stack_ffffffffffffffe8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffff0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_00;
  
  this_00 = *(UniqueLock<AnnotatedMixin<std::mutex>_> **)(in_FS_OFFSET + 0x28);
  pszFile = in_RDI;
  AssertLockNotHeldInline
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(Mutex *)0xffb319);
  MaybeCheckNotHeld(in_stack_ffffffffffffffb8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,pszFile,
             (int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  *(long *)(in_RDI + 0x1b0) = in_RSI + *(long *)(in_RDI + 0x1b0);
  if ((in_RDI[0x1a8] & 1U) != 0) {
    sVar3 = *(size_type *)(in_RDI + 0x1b0);
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffffb8);
    if (sVar3 == sVar1) {
      in_RDI[0x1a8] = '\0';
      in_RDI[0x1b0] = '\0';
      in_RDI[0x1b1] = '\0';
      in_RDI[0x1b2] = '\0';
      in_RDI[0x1b3] = '\0';
      in_RDI[0x1b4] = '\0';
      in_RDI[0x1b5] = '\0';
      in_RDI[0x1b6] = '\0';
      in_RDI[0x1b7] = '\0';
      goto LAB_00ffb418;
    }
  }
  if ((in_RDI[0x1a8] & 1U) == 0) {
    in_stack_ffffffffffffffb8 = *(Mutex **)(in_RDI + 0x1b0);
    pMVar2 = (Mutex *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_ffffffffffffffb8);
    if (in_stack_ffffffffffffffb8 == pMVar2) {
      ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffb8)
      ;
      in_RDI[0x1b0] = '\0';
      in_RDI[0x1b1] = '\0';
      in_RDI[0x1b2] = '\0';
      in_RDI[0x1b3] = '\0';
      in_RDI[0x1b4] = '\0';
      in_RDI[0x1b5] = '\0';
      in_RDI[0x1b6] = '\0';
      in_RDI[0x1b7] = '\0';
    }
  }
LAB_00ffb418:
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffb8);
  if (*(UniqueLock<AnnotatedMixin<std::mutex>_> **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void V1Transport::MarkBytesSent(size_t bytes_sent) noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    m_bytes_sent += bytes_sent;
    if (m_sending_header && m_bytes_sent == m_header_to_send.size()) {
        // We're done sending a message's header. Switch to sending its data bytes.
        m_sending_header = false;
        m_bytes_sent = 0;
    } else if (!m_sending_header && m_bytes_sent == m_message_to_send.data.size()) {
        // We're done sending a message's data. Wipe the data vector to reduce memory consumption.
        ClearShrink(m_message_to_send.data);
        m_bytes_sent = 0;
    }
}